

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O3

string * pybind11::type_id<bool>(void)

{
  string *extraout_RAX;
  string *in_RDI;
  allocator local_19;
  
  std::__cxx11::string::string
            ((string *)in_RDI,_current_exception + (*_current_exception == '*'),&local_19);
  detail::clean_type_id(in_RDI);
  return extraout_RAX;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}